

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

void __thiscall
draco::AttributeQuantizationTransform::CopyToAttributeTransformData
          (AttributeQuantizationTransform *this,AttributeTransformData *out_data)

{
  size_type sVar1;
  AttributeTransformData *in_RSI;
  long in_RDI;
  int i;
  float *in_stack_ffffffffffffffc8;
  AttributeTransformData *in_stack_ffffffffffffffd0;
  undefined4 local_14;
  
  AttributeTransformData::set_transform_type(in_RSI,ATTRIBUTE_QUANTIZATION_TRANSFORM);
  AttributeTransformData::AppendParameterValue<int>
            (in_stack_ffffffffffffffd0,(int *)in_stack_ffffffffffffffc8);
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x10));
    if (sVar1 <= (ulong)(long)local_14) break;
    in_stack_ffffffffffffffd0 = in_RSI;
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x10),(long)local_14);
    AttributeTransformData::AppendParameterValue<float>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_14 = local_14 + 1;
  }
  AttributeTransformData::AppendParameterValue<float>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void AttributeQuantizationTransform::CopyToAttributeTransformData(
    AttributeTransformData *out_data) const {
  out_data->set_transform_type(ATTRIBUTE_QUANTIZATION_TRANSFORM);
  out_data->AppendParameterValue(quantization_bits_);
  for (int i = 0; i < min_values_.size(); ++i) {
    out_data->AppendParameterValue(min_values_[i]);
  }
  out_data->AppendParameterValue(range_);
}